

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_mm_comp(jit_State *J,RecordIndex *ix,int op)

{
  int iVar1;
  TRef TVar2;
  TRef mt2_1;
  TRef mt2;
  TValue mo1v;
  TValue *pTStack_188;
  TRef mo1;
  cTValue *bv;
  MMS mm;
  int op_local;
  RecordIndex *ix_local;
  jit_State *J_local;
  RecordIndex *local_160;
  undefined2 local_156;
  undefined2 local_154;
  undefined2 local_152;
  RecordIndex *local_150;
  undefined2 local_146;
  undefined2 local_144;
  undefined2 local_142;
  RecordIndex *local_140;
  undefined2 local_136;
  undefined2 local_134;
  undefined2 local_132;
  RecordIndex *local_130;
  TValue *local_128;
  TValue *local_120;
  undefined8 local_118;
  TValue *local_110;
  TValue *local_108;
  undefined8 local_100;
  TValue *local_f8;
  TValue *local_f0;
  undefined8 local_e8;
  TValue *local_e0;
  TValue *local_d8;
  undefined8 local_d0;
  TValue *local_c8;
  TRef *local_c0;
  undefined8 local_b8;
  TValue *local_b0;
  RecordIndex *local_a8;
  lua_State *local_a0;
  char *local_98;
  RecordIndex *local_90;
  lua_State *local_88;
  char *local_80;
  TRef *local_78;
  undefined8 local_70;
  char *local_68;
  TValue *local_60;
  undefined8 local_58;
  char *local_50;
  TValue *local_48;
  undefined8 local_40;
  char *local_38;
  TValue *local_30;
  undefined8 local_28;
  char *local_20;
  TValue *local_18;
  undefined8 local_10;
  
  ix->tab = ix->val;
  local_a0 = J->L;
  local_b0 = &ix->valv;
  ix->tabv = *local_b0;
  local_98 = "copy of dead GC object";
  bv._4_4_ = op;
  _mm = &ix->tabv;
  ix_local = (RecordIndex *)J;
  local_a8 = ix;
  local_90 = ix;
  local_88 = local_a0;
  do {
    bv._0_4_ = MM_lt;
    if ((bv._4_4_ & 2) != 0) {
      bv._0_4_ = MM_le;
    }
    iVar1 = lj_record_mm_lookup((jit_State *)ix_local,(RecordIndex *)_mm,(MMS)bv);
    if (iVar1 != 0) {
      mo1v.field_4.it = *(undefined4 *)(_mm + 8);
      local_b8._0_4_ = ix_local[1].val;
      local_b8._4_4_ = ix_local[1].mt;
      local_c8 = _mm + 3;
      local_c0 = &mt2_1;
      _mt2_1 = *local_c8;
      local_80 = "copy of dead GC object";
      pTStack_188 = _mm + 1;
      local_78 = local_c0;
      local_70 = local_b8;
      if (((int)(pTStack_188->field_4).it >> 0xf == -0xc) &&
         (*(uint64_t *)((pTStack_188->u64 & 0x7fffffffffff) + 0x20) == _mm[4].u64)) {
        local_130 = ix_local;
        local_132 = 0x450b;
        local_134 = (undefined2)*(undefined4 *)((long)_mm + 0x34);
        local_136 = 5;
        *(undefined2 *)((long)&ix_local[2].oldv + 4) = 0x450b;
        *(undefined2 *)&ix_local[2].oldv = local_134;
        *(undefined2 *)((long)&ix_local[2].oldv + 2) = 5;
        TVar2 = lj_opt_fold((jit_State *)ix_local);
        local_144 = (undefined2)TVar2;
        local_140 = ix_local;
        local_142 = 0x88b;
        local_146 = (undefined2)*(undefined4 *)((long)_mm + 0x3c);
        *(undefined2 *)((long)&ix_local[2].oldv + 4) = 0x88b;
        *(undefined2 *)&ix_local[2].oldv = local_144;
        *(undefined2 *)((long)&ix_local[2].oldv + 2) = local_146;
        lj_opt_fold((jit_State *)ix_local);
LAB_00198ed5:
        rec_mm_callcomp((jit_State *)ix_local,(RecordIndex *)&_mm->gcr,bv._4_4_);
        return;
      }
      if (((int)(pTStack_188->field_4).it >> 0xf == -0xd) &&
         (*(uint64_t *)((pTStack_188->u64 & 0x7fffffffffff) + 0x20) == _mm[4].u64)) {
        local_150 = ix_local;
        local_152 = 0x450b;
        local_154 = (undefined2)*(undefined4 *)((long)_mm + 0x34);
        local_156 = 0xb;
        *(undefined2 *)((long)&ix_local[2].oldv + 4) = 0x450b;
        *(undefined2 *)&ix_local[2].oldv = local_154;
        *(undefined2 *)((long)&ix_local[2].oldv + 2) = 0xb;
        TVar2 = lj_opt_fold((jit_State *)ix_local);
        J_local._4_2_ = (undefined2)TVar2;
        local_160 = ix_local;
        J_local._6_2_ = 0x88b;
        J_local._2_2_ = (undefined2)*(undefined4 *)((long)_mm + 0x3c);
        *(undefined2 *)((long)&ix_local[2].oldv + 4) = 0x88b;
        *(undefined2 *)&ix_local[2].oldv = J_local._4_2_;
        *(undefined2 *)((long)&ix_local[2].oldv + 2) = J_local._2_2_;
        lj_opt_fold((jit_State *)ix_local);
        goto LAB_00198ed5;
      }
      _mm[6].field_4.i = *(int32_t *)((long)_mm + 0x34);
      local_d0._0_4_ = ix_local[1].val;
      local_d0._4_4_ = ix_local[1].mt;
      local_d8 = _mm;
      _mm->field_4 = *(anon_struct_8_2_7fa0a05d_for_TValue_4 *)pTStack_188;
      local_60 = _mm;
      local_68 = "copy of dead GC object";
      local_e0 = pTStack_188;
      local_58 = local_d0;
      iVar1 = lj_record_mm_lookup((jit_State *)ix_local,(RecordIndex *)&_mm->gcr,(MMS)bv);
      if ((iVar1 != 0) &&
         (iVar1 = lj_record_objcmp((jit_State *)ix_local,mo1v.field_4.it,_mm[8].u32.lo,
                                   (cTValue *)&mt2_1,_mm + 3), iVar1 == 0)) goto LAB_00198ed5;
    }
    if ((bv._4_4_ & 2) == 0) {
      return;
    }
    _mm[6].field_4.i = *(TRef *)((long)_mm + 0x34);
    *(int32_t *)((long)_mm + 0x34) = _mm[7].field_4.i;
    _mm[7].field_4.i = _mm[6].field_4.i;
    local_e8._0_4_ = ix_local[1].val;
    local_e8._4_4_ = ix_local[1].mt;
    local_f0 = _mm;
    local_f8 = _mm + 1;
    *_mm = *local_f8;
    local_48 = _mm;
    local_50 = "copy of dead GC object";
    local_100._0_4_ = ix_local[1].val;
    local_100._4_4_ = ix_local[1].mt;
    local_108 = _mm + 1;
    local_110 = _mm + 2;
    *local_108 = *local_110;
    local_38 = "copy of dead GC object";
    local_118._0_4_ = ix_local[1].val;
    local_118._4_4_ = ix_local[1].mt;
    local_120 = _mm + 2;
    local_128 = _mm;
    (local_120->gcr).gcptr64 = ((uint64_t)*(GCRef *)_mm).gcptr64;
    local_20 = "copy of dead GC object";
    bv._4_4_ = bv._4_4_ ^ 3;
    local_40 = local_e8;
    local_30 = local_108;
    local_28 = local_100;
    local_18 = local_120;
    local_10 = local_118;
  } while( true );
}

Assistant:

static void rec_mm_comp(jit_State *J, RecordIndex *ix, int op)
{
  ix->tab = ix->val;
  copyTV(J->L, &ix->tabv, &ix->valv);
  while (1) {
    MMS mm = (op & 2) ? MM_le : MM_lt;  /* Try __le + __lt or only __lt. */
#if LJ_52
    if (!lj_record_mm_lookup(J, ix, mm)) {  /* Lookup mm on 1st operand. */
      ix->tab = ix->key;
      copyTV(J->L, &ix->tabv, &ix->keyv);
      if (!lj_record_mm_lookup(J, ix, mm))  /* Lookup mm on 2nd operand. */
	goto nomatch;
    }
    rec_mm_callcomp(J, ix, op);
    return;
#else
    if (lj_record_mm_lookup(J, ix, mm)) {  /* Lookup mm on 1st operand. */
      cTValue *bv;
      TRef mo1 = ix->mobj;
      TValue mo1v;
      copyTV(J->L, &mo1v, &ix->mobjv);
      /* Avoid the 2nd lookup and the objcmp if the metatables are equal. */
      bv = &ix->keyv;
      if (tvistab(bv) && tabref(tabV(bv)->metatable) == ix->mtv) {
	TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_TAB_META);
	emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
      } else if (tvisudata(bv) && tabref(udataV(bv)->metatable) == ix->mtv) {
	TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_UDATA_META);
	emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
      } else {  /* Lookup metamethod on 2nd operand and compare both. */
	ix->tab = ix->key;
	copyTV(J->L, &ix->tabv, bv);
	if (!lj_record_mm_lookup(J, ix, mm) ||
	    lj_record_objcmp(J, mo1, ix->mobj, &mo1v, &ix->mobjv))
	  goto nomatch;
      }
      rec_mm_callcomp(J, ix, op);
      return;
    }
#endif
  nomatch:
    /* Lookup failed. Retry with  __lt and swapped operands. */
    if (!(op & 2)) break;  /* Already at __lt. Interpreter will throw. */
    ix->tab = ix->key; ix->key = ix->val; ix->val = ix->tab;
    copyTV(J->L, &ix->tabv, &ix->keyv);
    copyTV(J->L, &ix->keyv, &ix->valv);
    copyTV(J->L, &ix->valv, &ix->tabv);
    op ^= 3;
  }
}